

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O1

uint64 libebml::ReadCodedSizeValue(binary *InBuffer,uint32 *BufferSize,uint64 *SizeUnknown)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  size_t __n;
  binary PossibleSize [8];
  undefined8 local_28;
  
  local_28 = 0;
  *SizeUnknown = 0x7f;
  uVar1 = *BufferSize;
  if (uVar1 != 0) {
    uVar2 = 8;
    if (uVar1 < 8) {
      uVar2 = uVar1;
    }
    lVar5 = 0;
    do {
      if ((char)(*InBuffer << ((byte)lVar5 & 0x1f)) < '\0') {
        __n = lVar5 + 1;
        memcpy(&local_28,InBuffer,__n);
        uVar3 = (ulong)(-0x81 >> ((byte)lVar5 & 0x1f) & (uint)(byte)local_28);
        if ((int)lVar5 != 0) {
          lVar4 = 0;
          do {
            uVar3 = (ulong)*(byte *)((long)&local_28 + lVar4 + 1) | uVar3 << 8;
            lVar4 = lVar4 + 1;
          } while (lVar5 != lVar4);
        }
        goto LAB_001832bd;
      }
      *SizeUnknown = *SizeUnknown << 7 | 0xff;
      lVar5 = lVar5 + 1;
    } while (uVar2 != (uint)lVar5);
  }
  __n = 0;
  uVar3 = 0;
LAB_001832bd:
  *BufferSize = (uint32)__n;
  return uVar3;
}

Assistant:

uint64 ReadCodedSizeValue(const binary * InBuffer, uint32 & BufferSize, uint64 & SizeUnknown)
{
  binary SizeBitMask = 1 << 7;
  uint64 Result = 0x7F;
  unsigned int SizeIdx, PossibleSizeLength = 0;
  binary PossibleSize[8];
  memset(PossibleSize, 0, 8);

  SizeUnknown = 0x7F; // the last bit is discarded when computing the size
  for (SizeIdx = 0; SizeIdx < BufferSize && SizeIdx < 8; SizeIdx++) {
    if (InBuffer[0] & (SizeBitMask >> SizeIdx)) {
      // ID found
      PossibleSizeLength = SizeIdx + 1;
      SizeBitMask >>= SizeIdx;

      // Guard against invalid memory accesses with incomplete IDs.
      if (PossibleSizeLength > BufferSize)
        break;

      for (SizeIdx = 0; SizeIdx < PossibleSizeLength; SizeIdx++) {
        PossibleSize[SizeIdx] = InBuffer[SizeIdx];
      }
      for (SizeIdx = 0; SizeIdx < PossibleSizeLength - 1; SizeIdx++) {
        Result <<= 7;
        Result |= 0xFF;
      }

      Result = 0;
      Result |= PossibleSize[0] & ~SizeBitMask;
      for (unsigned int i = 1; i<PossibleSizeLength; i++) {
        Result <<= 8;
        Result |= PossibleSize[i];
      }

      BufferSize = PossibleSizeLength;

      return Result;
    }
    SizeUnknown <<= 7;
    SizeUnknown |= 0xFF;
  }

  BufferSize = 0;
  return 0;
}